

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:645:59)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:645:59)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  long *plVar4;
  undefined8 *puVar5;
  object *poVar6;
  uint *puVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar8;
  pointer pvVar9;
  uint uVar10;
  ulong uVar11;
  _Alloc_hider this_00;
  double dVar12;
  wstring is;
  object_ptr o;
  value search_element;
  double local_f8;
  wstring_view local_e8;
  wstring local_d8;
  gc_heap_ptr_untyped local_b8;
  value *local_a8;
  value local_a0;
  gc_heap_ptr_untyped *local_78;
  ulong local_70;
  gc_heap_ptr_untyped *local_68;
  gc_heap_ptr_untyped *local_60;
  value local_58;
  
  plVar4 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar4 + 0x88))(&local_b8,plVar4,this_);
  puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_b8);
  local_58.type_ = reference;
  local_58._4_4_ = 0;
  local_58.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x19a8f4;
  (**(code **)*puVar5)(&local_a0,puVar5);
  uVar3 = to_uint32(&local_a0);
  value::destroy(&local_a0);
  if (uVar3 == 0) {
    local_f8 = -1.0;
    goto LAB_001359c4;
  }
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish == pvVar9) {
    pvVar9 = (pointer)&value::undefined;
  }
  value::value(&local_a0,pvVar9);
  if ((local_a0.type_ == number) && (NAN(local_a0.field_1.n_))) {
LAB_001359ad:
    local_f8 = -1.0;
  }
  else {
    pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar12 = 0.0;
    uVar8 = extraout_RDX;
    if (1 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) *
                   -0x3333333333333333)) {
      dVar12 = to_integer(pvVar9 + 1);
      uVar8 = extraout_RDX_00;
    }
    if ((double)uVar3 <= dVar12) goto LAB_001359ad;
    if (0.0 <= dVar12) {
      uVar11 = (ulong)dVar12;
    }
    else {
      dVar12 = (double)uVar3 - ABS(dVar12);
      uVar11 = 0;
      if (0.0 <= dVar12) {
        uVar11 = (ulong)dVar12;
      }
    }
    if (uVar3 < 0x10000) {
      if ((uint)uVar11 < uVar3) {
        do {
          index_string_abi_cxx11_(&local_d8,(mjs *)(uVar11 & 0xffffffff),(uint32_t)uVar8);
          poVar6 = (object *)gc_heap_ptr_untyped::get(&local_b8);
          local_e8._M_len = local_d8._M_string_length;
          local_e8._M_str = local_d8._M_dataplus._M_p;
          bVar1 = object::has_property(poVar6,&local_e8);
          if (bVar1) {
            puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_b8);
            local_68 = (gc_heap_ptr_untyped *)local_d8._M_string_length;
            local_60 = (gc_heap_ptr_untyped *)local_d8._M_dataplus._M_p;
            (**(code **)*puVar5)(&local_58,puVar5,&local_68);
            bVar1 = operator==(&local_58,&local_a0);
            value::destroy(&local_58);
            uVar8 = extraout_RDX_02;
          }
          else {
            bVar1 = false;
            uVar8 = extraout_RDX_01;
          }
          if (bVar1 != false) {
            local_f8 = (double)(uVar11 & 0xffffffff);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 4 + 4
                           );
            uVar8 = extraout_RDX_03;
          }
          if (bVar1 != false) goto LAB_001359ba;
          uVar10 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar10;
        } while (uVar3 != uVar10);
      }
      goto LAB_001359ad;
    }
    local_70 = uVar11;
    poVar6 = (object *)gc_heap_ptr_untyped::get(&local_b8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_d8,poVar6);
    local_78 = (gc_heap_ptr_untyped *)local_d8._M_string_length;
    bVar1 = local_d8._M_dataplus._M_p == (pointer)local_d8._M_string_length;
    if (!bVar1) {
      bVar1 = false;
      this_00._M_p = local_d8._M_dataplus._M_p;
      local_a8 = __return_storage_ptr__;
      do {
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00._M_p);
        local_e8._M_str = (wchar_t *)(puVar7 + 1);
        local_e8._M_len = (size_t)*puVar7;
        uVar3 = index_value_from_string(&local_e8);
        if (uVar3 < (uint)local_70 || uVar3 == 0xffffffff) {
          bVar2 = false;
        }
        else {
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_b8);
          puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00._M_p);
          local_e8._M_str = (wchar_t *)(puVar7 + 1);
          local_e8._M_len = (size_t)*puVar7;
          (**(code **)*puVar5)(&local_58,puVar5,&local_e8);
          bVar2 = operator==(&local_58,&local_a0);
          value::destroy(&local_58);
        }
        __return_storage_ptr__ = local_a8;
        if (bVar2 != false) {
          local_f8 = (double)uVar3;
          break;
        }
        this_00._M_p = this_00._M_p + 0x10;
        bVar1 = (gc_heap_ptr_untyped *)this_00._M_p == local_78;
      } while (!bVar1);
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_d8);
    if (bVar1) goto LAB_001359ad;
  }
LAB_001359ba:
  value::destroy(&local_a0);
LAB_001359c4:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b8);
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = local_f8;
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }